

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring_bitmap_add_many(roaring_bitmap_t *r,size_t n_args,uint32_t *vals)

{
  uint val;
  uint8_t uVar1;
  container_t *c;
  container_t *c_00;
  uint32_t val_00;
  size_t sVar2;
  uint8_t typecode;
  uint8_t newtypecode;
  int containerindex;
  roaring_array_t *local_38;
  
  typecode = '\0';
  containerindex = 0;
  if (n_args != 0) {
    val_00 = *vals;
    local_38 = &r->high_low_container;
    c = containerptr_roaring_bitmap_add(r,val_00,&typecode,&containerindex);
    for (sVar2 = 1; n_args != sVar2; sVar2 = sVar2 + 1) {
      val = vals[sVar2];
      if ((val_00 ^ val) < 0x10000) {
        newtypecode = typecode;
        c_00 = container_add(c,(uint16_t)val,typecode,&newtypecode);
        if (c_00 != c) {
          container_free(c,typecode);
          uVar1 = newtypecode;
          ra_set_container_at_index(local_38,containerindex,c_00,newtypecode);
          typecode = uVar1;
          c = c_00;
        }
      }
      else {
        c = containerptr_roaring_bitmap_add
                      ((roaring_bitmap_t *)local_38,val,&typecode,&containerindex);
      }
      val_00 = val;
    }
  }
  return;
}

Assistant:

void roaring_bitmap_add_many(roaring_bitmap_t *r, size_t n_args,
                             const uint32_t *vals) {
    container_t *container = NULL;  // hold value of last container touched
    uint8_t typecode = 0;    // typecode of last container touched
    uint32_t prev = 0;       // previous valued inserted
    size_t i = 0;            // index of value
    int containerindex = 0;
    if (n_args == 0) return;
    uint32_t val;
    memcpy(&val, vals + i, sizeof(val));
    container =
        containerptr_roaring_bitmap_add(r, val, &typecode, &containerindex);
    prev = val;
    i++;
    for (; i < n_args; i++) {
        memcpy(&val, vals + i, sizeof(val));
        if (((prev ^ val) >> 16) ==
            0) {  // no need to seek the container, it is at hand
            // because we already have the container at hand, we can do the
            // insertion
            // automatically, bypassing the roaring_bitmap_add call
            uint8_t newtypecode = typecode;
            container_t *container2 =
                container_add(container, val & 0xFFFF, typecode, &newtypecode);
            if (container2 != container) {  // rare instance when we need to
                                            // change the container type
                container_free(container, typecode);
                ra_set_container_at_index(&r->high_low_container,
                                          containerindex, container2,
                                          newtypecode);
                typecode = newtypecode;
                container = container2;
            }
        } else {
            container = containerptr_roaring_bitmap_add(r, val, &typecode,
                                                        &containerindex);
        }
        prev = val;
    }
}